

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testlab6-2.c
# Opt level: O0

int feederBig(void)

{
  int iVar1;
  FILE *__stream;
  size_t sVar2;
  uint local_1c;
  int T;
  int i;
  FILE *in;
  
  __stream = fopen("in.txt","w+");
  if (__stream == (FILE *)0x0) {
    printf("can\'t create in.txt. No space on disk?\n");
    in._4_4_ = -1;
  }
  else {
    fprintf(__stream,"%d\n",2);
    fprintf(__stream,"2000000\n");
    for (local_1c = 0; (int)local_1c < 2000000; local_1c = local_1c + 1) {
      iVar1 = fprintf(__stream,"%d ",(ulong)local_1c);
      if (iVar1 < 0) {
        printf("can\'t create in.txt. No space on disk?\n");
        fclose(__stream);
        return -1;
      }
    }
    fprintf(__stream,"\n");
    fclose(__stream);
    sVar2 = GetLabPointerSize();
    LabMemoryLimit = (sVar2 * 2 + 8) * 20000000 + 0x400000;
    in._4_4_ = 0;
  }
  return in._4_4_;
}

Assistant:

static int feederBig(void)
{
    FILE *const in = fopen("in.txt", "w+");
    int i;
    int T = 2;
    if (!in) {
        printf("can't create in.txt. No space on disk?\n");
        return -1;
    }
    fprintf(in, "%d\n", T);
    fprintf(in, "2000000\n");
    for (i = 0; i < 2000000; i++) {
        if (fprintf(in, "%d ", i) < 0) {
            printf("can't create in.txt. No space on disk?\n");
            fclose(in);
            return -1;
        }
    }
    fprintf(in, "\n");
    fclose(in);
    LabMemoryLimit = 20000000*((sizeof(int)+T-2)/(T-1)+sizeof(int)+2*GetLabPointerSize())+MIN_PROCESS_RSS_BYTES;
    return 0;
}